

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O3

void test_96(QPDF *pdf,char *arg2)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  int iVar2;
  long *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_30;
  long local_28 [2];
  long *local_18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_10;
  
  operator____qpdf((char *)&local_18,0x14c87e);
  QPDFObjectHandle::unparseBinary_abi_cxx11_();
  iVar2 = std::__cxx11::string::compare((char *)&local_38);
  if (iVar2 != 0) {
    __assert_fail("s.unparseBinary() == \"<043821385104>\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0xd60,"void test_96(QPDF &, const char *)");
  }
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  operator____qpdf((char *)&local_38,0x14c8e6);
  p_Var1 = p_Stack_10;
  p_Stack_10 = p_Stack_30;
  local_18 = local_38;
  local_38 = (long *)0x0;
  p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    if (p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
    }
  }
  QPDFObjectHandle::unparseBinary_abi_cxx11_();
  iVar2 = std::__cxx11::string::compare((char *)&local_38);
  if (iVar2 != 0) {
    __assert_fail("s.unparseBinary() == \"<043821385121>\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0xd62,"void test_96(QPDF &, const char *)");
  }
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  operator____qpdf((char *)&local_38,0x14c92c);
  p_Var1 = p_Stack_10;
  p_Stack_10 = p_Stack_30;
  local_18 = local_38;
  local_38 = (long *)0x0;
  p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    if (p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
    }
  }
  QPDFObjectHandle::unparseBinary_abi_cxx11_();
  iVar2 = std::__cxx11::string::compare((char *)&local_38);
  if (iVar2 != 0) {
    __assert_fail("s.unparseBinary() == \"<a0>\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0xd64,"void test_96(QPDF &, const char *)");
  }
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  operator____qpdf((char *)&local_38,0x14c951);
  p_Var1 = p_Stack_10;
  p_Stack_10 = p_Stack_30;
  local_18 = local_38;
  local_38 = (long *)0x0;
  p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    if (p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
    }
  }
  QPDFObjectHandle::unparseBinary_abi_cxx11_();
  iVar2 = std::__cxx11::string::compare((char *)&local_38);
  if (iVar2 == 0) {
    if (local_38 != local_28) {
      operator_delete(local_38,local_28[0] + 1);
    }
    if (p_Stack_10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_10);
    }
    return;
  }
  __assert_fail("s.unparseBinary() == \"<abc0>\"",
                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc",
                0xd66,"void test_96(QPDF &, const char *)");
}

Assistant:

static void
test_96(QPDF& pdf, char const* arg2)
{
    // Test edge cases with quoted characters and string parsing.

    auto s = R"((\48\418\121\4))"_qpdf;
    assert(s.unparseBinary() == "<043821385104>");
    s = R"((\48\418\121\41))"_qpdf;
    assert(s.unparseBinary() == "<043821385121>");
    s = R"(<a>)"_qpdf;
    assert(s.unparseBinary() == "<a0>");
    s = R"(<abc>)"_qpdf;
    assert(s.unparseBinary() == "<abc0>");
}